

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGuiStb::STB_TEXTEDIT_INSERTCHARS
               (ImGuiTextEditState *obj,int pos,ImWchar *new_text,int new_text_len)

{
  unsigned_short *__src;
  unsigned_short *puVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  
  iVar5 = obj->CurLenW;
  if (iVar5 < pos) {
    __assert_fail("pos <= text_len",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0x272d,
                  "bool ImGuiStb::STB_TEXTEDIT_INSERTCHARS(ImGuiTextEditState *, int, const ImWchar *, int)"
                 );
  }
  if (new_text_len + iVar5 < (obj->Text).Size) {
    lVar6 = (long)new_text_len;
    iVar3 = ImTextCountUtf8BytesFromStr(new_text,new_text + lVar6);
    iVar4 = obj->CurLenA + iVar3;
    bVar2 = iVar4 < obj->BufSizeA;
    if (iVar4 < obj->BufSizeA) {
      puVar1 = (obj->Text).Data;
      if (iVar5 - pos != 0) {
        __src = puVar1 + pos;
        memmove(__src + lVar6,__src,(long)(iVar5 - pos) * 2);
      }
      memcpy(puVar1 + pos,new_text,lVar6 * 2);
      lVar6 = obj->CurLenW + lVar6;
      iVar5 = (int)lVar6;
      obj->CurLenW = iVar5;
      obj->CurLenA = obj->CurLenA + iVar3;
      if ((obj->Text).Size <= iVar5) {
        __assert_fail("i < Size",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.h"
                      ,0x4c0,
                      "value_type &ImVector<unsigned short>::operator[](int) [T = unsigned short]");
      }
      (obj->Text).Data[lVar6] = 0;
      bVar2 = true;
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

static bool STB_TEXTEDIT_INSERTCHARS(STB_TEXTEDIT_STRING* obj, int pos, const ImWchar* new_text, int new_text_len)
{
    const int text_len = obj->CurLenW;
    IM_ASSERT(pos <= text_len);
    if (new_text_len + text_len + 1 > obj->Text.Size)
        return false;

    const int new_text_len_utf8 = ImTextCountUtf8BytesFromStr(new_text, new_text + new_text_len);
    if (new_text_len_utf8 + obj->CurLenA + 1 > obj->BufSizeA)
        return false;

    ImWchar* text = obj->Text.Data;
    if (pos != text_len)
        memmove(text + pos + new_text_len, text + pos, (size_t)(text_len - pos) * sizeof(ImWchar));
    memcpy(text + pos, new_text, (size_t)new_text_len * sizeof(ImWchar));

    obj->CurLenW += new_text_len;
    obj->CurLenA += new_text_len_utf8;
    obj->Text[obj->CurLenW] = '\0';

    return true;
}